

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::averageDownSolutionRHS
          (MLNodeLaplacian *this,int camrlev,MultiFab *crse_sol,MultiFab *crse_rhs,
          MultiFab *fine_sol,MultiFab *fine_rhs)

{
  uint uVar1;
  int iVar2;
  MultiFab *in_RDI;
  FabArrayBase *in_R9;
  MultiFab frhs;
  int *amrrr;
  MultiFab *in_stack_00001758;
  MultiFab *in_stack_00001760;
  int in_stack_0000176c;
  MLNodeLaplacian *in_stack_00001770;
  undefined8 in_stack_fffffffffffffdc8;
  MLLinOp *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffde8;
  MFInfo *info;
  MultiFab *in_stack_fffffffffffffe00;
  BoxArray *in_stack_fffffffffffffe08;
  FabFactory<amrex::FArrayBox> this_00;
  undefined8 in_stack_fffffffffffffe18;
  Arena *in_stack_fffffffffffffe20;
  Arena *factory;
  pointer in_stack_fffffffffffffe28;
  pointer in_stack_fffffffffffffe30;
  int local_3c;
  int *local_38;
  FabArrayBase *local_30;
  
  iVar2 = SUB84(in_stack_fffffffffffffe18,4);
  local_30 = in_R9;
  local_3c = MLLinOp::AMRRefRatio
                       (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  local_38 = &local_3c;
  average_down((MultiFab *)in_stack_fffffffffffffe30,(MultiFab *)in_stack_fffffffffffffe28,
               (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),(int)in_stack_fffffffffffffe20,iVar2)
  ;
  uVar1 = (*(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[0x1e])
                    (in_RDI,0);
  if ((uVar1 & 1) != 0) {
    FabArrayBase::boxArray(local_30);
    FabArrayBase::DistributionMap(local_30);
    iVar2 = *local_38 + -1;
    factory = (Arena *)0x0;
    info = (MFInfo *)&stack0xfffffffffffffe18;
    MFInfo::MFInfo((MFInfo *)0x12d809f);
    this_00._vptr_FabFactory = (_func_int **)0x0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)&stack0xfffffffffffffe10);
    MultiFab::MultiFab((MultiFab *)this_00._vptr_FabFactory,in_stack_fffffffffffffe08,
                       (DistributionMapping *)in_stack_fffffffffffffe00,(int)((ulong)in_RDI >> 0x20)
                       ,(int)in_RDI,info,(FabFactory<amrex::FArrayBox> *)factory);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x12d80f1);
    MFInfo::~MFInfo((MFInfo *)0x12d80fb);
    MultiFab::Copy(in_stack_fffffffffffffe00,in_RDI,(int)((ulong)info >> 0x20),(int)info,iVar2,
                   in_stack_fffffffffffffde8);
    restrictInteriorNodes(in_stack_00001770,in_stack_0000176c,in_stack_00001760,in_stack_00001758);
    MultiFab::~MultiFab((MultiFab *)0x12d8148);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::averageDownSolutionRHS (int camrlev, MultiFab& crse_sol, MultiFab& crse_rhs,
                                         const MultiFab& fine_sol, const MultiFab& fine_rhs)
{
    const auto& amrrr = AMRRefRatio(camrlev);
    amrex::average_down(fine_sol, crse_sol, 0, 1, amrrr);

    if (isSingular(0))
    {
        MultiFab frhs(fine_rhs.boxArray(), fine_rhs.DistributionMap(), 1, amrrr-1);
        MultiFab::Copy(frhs, fine_rhs, 0, 0, 1, 0);
        restrictInteriorNodes(camrlev, crse_rhs, frhs);
    }
}